

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

void __thiscall
mp::NLFeeder_Easy::
FeedVarBounds<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLFeeder_Easy>>::VarBndWriter>
          (NLFeeder_Easy *this,VarBndWriter *vbw)

{
  int iVar1;
  NLModel *this_00;
  double in_RSI;
  NLFeeder_Easy *in_RDI;
  int i;
  NLW2_ColData_C vars;
  int in_stack_ffffffffffffff9c;
  NLFeeder_Easy *this_01;
  double lb;
  VarBndWriter *this_02;
  int local_34;
  NLW2_ColData_C local_30;
  double local_10;
  
  local_10 = in_RSI;
  this_00 = NLME(in_RDI);
  NLModel::ColData(&local_30,this_00);
  for (local_34 = 0; local_34 < (in_RDI->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_vars
      ; local_34 = local_34 + 1) {
    this_01 = (NLFeeder_Easy *)local_30.lower_;
    lb = local_10;
    iVar1 = VPermInv((NLFeeder_Easy *)local_30.lower_,in_stack_ffffffffffffff9c);
    this_02 = (VarBndWriter *)(&(this_01->nlme_).prob_name_)[iVar1];
    VPermInv(this_01,in_stack_ffffffffffffff9c);
    NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::VarBndWriter::WriteLbUb
              (this_02,lb,(double)this_01);
  }
  return;
}

Assistant:

void FeedVarBounds(VarBoundsWriter& vbw) {
    auto vars = NLME().ColData();
    for (int i = 0; i < header_.num_vars; i++)
      vbw.WriteLbUb(vars.lower_[VPermInv(i)],
                    vars.upper_[VPermInv(i)]);
  }